

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMovemRgEa<(moira::Instr)77,(moira::Mode)7,(moira::Size)4>(Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  u32 uVar3;
  int i;
  long lVar4;
  AEStackFrame frame;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar3 = computeEA<(moira::Mode)7,(moira::Size)4,0ul>(this,opcode & 7);
  if ((uVar1 != 0 & (byte)uVar3) != 0) {
    this->fcl = '\x01';
    frame = makeFrame<72ul>(this,uVar3);
    execAddressError(this,frame,0);
    return;
  }
  lVar4 = 0;
  do {
    if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      uVar2 = *(uint *)((long)this->exec + lVar4 * 4 + -0x58);
      writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,uVar3,uVar2 >> 0x10);
      writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,uVar3 + 2,uVar2 & 0xffff);
      uVar3 = uVar3 + 4;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  return;
}

Assistant:

void
Moira::execMovemRgEa(u16 opcode)
{
    int dst  = _____________xxx(opcode);
    u16 mask = readI<Word>();

    switch (M) {

        case 4: // -(An)
        {
            u32 ea = readA(dst);
            
            // Check for address error
            if (mask && misaligned<S>(ea)) {
                setFC<M>();
                execAddressError(makeFrame <AE_INC_PC|AE_WRITE> (ea - S));
                return;
            }

            for(int i = 15; i >= 0; i--) {

                if (mask & (0x8000 >> i)) {
                    ea -= S;
                    writeM <M, S, MIMIC_MUSASHI ? REVERSE : 0> (ea, reg.r[i]);
                }
            }
            writeA(dst, ea);
            break;
        }
        default:
        {
            u32 ea = computeEA<M,S>(dst);
            
            // Check for address error
            if (mask && misaligned<S>(ea)) {
                setFC<M>();
                execAddressError(makeFrame <AE_INC_PC|AE_WRITE> (ea));
                return;
            }
  
            for(int i = 0; i < 16; i++) {
                
                if (mask & (1 << i)) {
                    writeM <M, S> (ea, reg.r[i]);
                    ea += S;
                }
            }
            break;
        }
    }
    prefetch<POLLIPL>();
}